

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParse.c
# Opt level: O1

wchar_t * uriParsePathAbsEmptyW
                    (UriParserStateW *state,wchar_t *first,wchar_t *afterLast,
                    UriMemoryManager *memory)

{
  UriUriW *pUVar1;
  wchar_t *pwVar2;
  UriPathSegmentStructW *pUVar3;
  int *piVar4;
  wchar_t *first_00;
  
  do {
    if (afterLast <= first) {
      return afterLast;
    }
    if (*first != L'/') {
      return first;
    }
    first_00 = first + 1;
    first = uriParseSegmentW(state,first_00,afterLast,memory);
    if (first == (wchar_t *)0x0) {
      return (wchar_t *)0x0;
    }
    pUVar3 = (UriPathSegmentStructW *)(*memory->calloc)(memory,1,0x20);
    if (pUVar3 == (UriPathSegmentStructW *)0x0) break;
    piVar4 = anon_var_dwarf_faa62;
    pwVar2 = piVar4;
    if (first_00 != first) {
      piVar4 = first;
      pwVar2 = first_00;
    }
    (pUVar3->text).first = pwVar2;
    (pUVar3->text).afterLast = piVar4;
    pUVar1 = state->uri;
    if (pUVar1->pathHead == (UriPathSegmentW *)0x0) {
      pUVar1->pathHead = pUVar3;
    }
    else {
      pUVar1->pathTail->next = pUVar3;
    }
    pUVar1->pathTail = pUVar3;
  } while (pUVar3 != (UriPathSegmentStructW *)0x0);
  uriFreeUriMembersMmW(state->uri,memory);
  state->errorPos = (wchar_t *)0x0;
  state->errorCode = L'\x03';
  return (wchar_t *)0x0;
}

Assistant:

static const URI_CHAR * URI_FUNC(ParsePathAbsEmpty)(
		URI_TYPE(ParserState) * state, const URI_CHAR * first,
		const URI_CHAR * afterLast, UriMemoryManager * memory) {
	if (first >= afterLast) {
		return afterLast;
	}

	switch (*first) {
	case _UT('/'):
		{
			const URI_CHAR * const afterSegment
					= URI_FUNC(ParseSegment)(state, first + 1, afterLast, memory);
			if (afterSegment == NULL) {
				return NULL;
			}
			if (!URI_FUNC(PushPathSegment)(state, first + 1, afterSegment, memory)) { /* SEGMENT BOTH */
				URI_FUNC(StopMalloc)(state, memory);
				return NULL;
			}
			return URI_FUNC(ParsePathAbsEmpty)(state, afterSegment, afterLast, memory);
		}

	default:
		return first;
	}
}